

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O3

Expression __thiscall
cnn::expr::detail::
f<cnn::Sum,std::vector<cnn::expr::Expression,std::allocator<cnn::expr::Expression>>>
          (detail *this,vector<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_> *xs)

{
  pointer *pppNVar1;
  ComputationGraph *this_00;
  pointer pEVar2;
  iterator __position;
  pointer pEVar3;
  Node *pNVar4;
  VariableIndex *pVVar5;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar6;
  Expression EVar7;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> xis;
  allocator_type local_3d;
  VariableIndex local_3c;
  Node *local_38;
  vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_> local_30;
  
  pEVar3 = (xs->super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_start;
  this_00 = pEVar3->pg;
  std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>::vector
            (&local_30,
             (long)(xs->
                   super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>
                   )._M_impl.super__Vector_impl_data._M_finish - (long)pEVar3 >> 4,
             (allocator_type *)&local_38);
  pEVar2 = (xs->super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pVVar5 = local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
           _M_impl.super__Vector_impl_data._M_start;
  for (pEVar3 = (xs->
                super__Vector_base<cnn::expr::Expression,_std::allocator<cnn::expr::Expression>_>).
                _M_impl.super__Vector_impl_data._M_start; pEVar3 != pEVar2; pEVar3 = pEVar3 + 1) {
    pVVar5->t = (pEVar3->i).t;
    pVVar5 = pVVar5 + 1;
  }
  local_3c.t = (uint)((ulong)((long)(this_00->nodes).
                                    super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                             (long)(this_00->nodes).
                                   super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start) >> 3);
  pNVar4 = (Node *)operator_new(0x50);
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0028b498;
  std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>::
  vector<__gnu_cxx::__normal_iterator<cnn::VariableIndex_const*,std::vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>>>,void>
            ((vector<cnn::VariableIndex,std::allocator<cnn::VariableIndex>> *)&pNVar4->args,
             (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
              )local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_start,
             (__normal_iterator<const_cnn::VariableIndex_*,_std::vector<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>_>
              )local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
               _M_impl.super__Vector_impl_data._M_finish,&local_3d);
  (pNVar4->dim).nd = 0;
  (pNVar4->dim).bd = 1;
  pNVar4->_vptr_Node = (_func_int **)&PTR__Node_0028d450;
  __position._M_current =
       (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_38 = pNVar4;
  if (__position._M_current ==
      (this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<cnn::Node*,std::allocator<cnn::Node*>>::_M_realloc_insert<cnn::Node*>
              ((vector<cnn::Node*,std::allocator<cnn::Node*>> *)this_00,__position,&local_38);
  }
  else {
    *__position._M_current = pNVar4;
    pppNVar1 = &(this_00->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    *pppNVar1 = *pppNVar1 + 1;
  }
  ComputationGraph::set_dim_for_new_node(this_00,&local_3c);
  *(ComputationGraph **)this = this_00;
  *(uint *)(this + 8) = local_3c.t;
  uVar6 = extraout_RDX;
  if (local_30.super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>._M_impl.
      super__Vector_impl_data._M_start != (VariableIndex *)0x0) {
    operator_delete(local_30.
                    super__Vector_base<cnn::VariableIndex,_std::allocator<cnn::VariableIndex>_>.
                    _M_impl.super__Vector_impl_data._M_start);
    uVar6 = extraout_RDX_00;
  }
  EVar7._8_8_ = uVar6;
  EVar7.pg = (ComputationGraph *)this;
  return EVar7;
}

Assistant:

Expression f(const T& xs) {
    ComputationGraph *pg = xs.begin()->pg;
    std::vector<VariableIndex> xis(xs.size());
    int i = 0;
    for (auto xi = xs.begin(); xi != xs.end(); ++xi) xis[i++] = xi->i;
    return Expression(pg, pg->add_function<F>(xis));
  }